

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

void Dau_DecSortSet(uint set,int nVars,int *pnUnique,int *pnShared,int *pnFree)

{
  uint uVar1;
  int local_38;
  int Value;
  int nFree;
  int nShared;
  int nUnique;
  int v;
  int *pnFree_local;
  int *pnShared_local;
  int *pnUnique_local;
  int nVars_local;
  uint set_local;
  
  nFree = 0;
  Value = 0;
  local_38 = 0;
  nShared = 0;
  do {
    if (nVars <= nShared) {
      *pnUnique = nFree;
      *pnShared = Value;
      *pnFree = local_38;
      return;
    }
    uVar1 = set >> ((byte)(nShared << 1) & 0x1f) & 3;
    if (uVar1 == 1) {
      nFree = nFree + 1;
    }
    else if (uVar1 == 3) {
      Value = Value + 1;
    }
    else {
      if (uVar1 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                      ,0x180,"void Dau_DecSortSet(unsigned int, int, int *, int *, int *)");
      }
      local_38 = local_38 + 1;
    }
    nShared = nShared + 1;
  } while( true );
}

Assistant:

void Dau_DecSortSet( unsigned set, int nVars, int * pnUnique, int * pnShared, int * pnFree )
{
    int v;
    int nUnique = 0, nShared = 0, nFree = 0;
    for ( v = 0; v < nVars; v++ )
    {
        int Value = ((set >> (v << 1)) & 3);
        if ( Value == 1 )
            nUnique++;
        else if ( Value == 3 )
            nShared++;
        else if ( Value == 0 )
            nFree++;
        else assert( 0 );
    }
    *pnUnique = nUnique;
    *pnShared = nShared;
    *pnFree   = nFree;
}